

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::OutOfMemoryException::
OutOfMemoryException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (OutOfMemoryException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string *in_stack_ffffffffffffff18;
  string local_b8 [48];
  string local_88 [32];
  string local_68 [32];
  string local_48 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_00;
  string *msg_00;
  
  params_1_00 = in_R8;
  params_00 = in_RCX;
  msg_00 = in_RDX;
  ::std::__cxx11::string::string(local_68,(string *)in_RDX);
  ::std::__cxx11::string::string(local_88,(string *)in_RCX);
  ::std::__cxx11::string::string(local_b8,(string *)in_R8);
  Exception::ConstructMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (msg_00,params_00,params_1_00,in_stack_ffffffffffffffd0);
  OutOfMemoryException((OutOfMemoryException *)in_RDX,in_stack_ffffffffffffff18);
  ::std::__cxx11::string::~string(local_48);
  ::std::__cxx11::string::~string(local_b8);
  ::std::__cxx11::string::~string(local_88);
  ::std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

explicit OutOfMemoryException(const string &msg, ARGS... params)
	    : OutOfMemoryException(ConstructMessage(msg, params...)) {
	}